

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall HFSubConsumer::initialize(HFSubConsumer *this)

{
  zactor_t *pzVar1;
  char *endpoints;
  zsock_t *pzVar2;
  void *pvVar3;
  void *in_RDI;
  
  if (*(long *)((long)in_RDI + 0x98) == 0) {
    pzVar1 = zactor_new(ringbufController,in_RDI);
    *(zactor_t **)((long)in_RDI + 0x98) = pzVar1;
  }
  endpoints = (char *)std::__cxx11::string::c_str();
  pzVar2 = zsock_new_req_checked
                     (endpoints,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                      ,0xaf);
  *(zsock_t **)((long)in_RDI + 0x380) = pzVar2;
  pvVar3 = malloc(0x10);
  *(void **)((long)in_RDI + 0x3b8) = pvVar3;
  pvVar3 = zsock_resolve(*(void **)((long)in_RDI + 0x380));
  **(undefined8 **)((long)in_RDI + 0x3b8) = pvVar3;
  *(undefined4 *)(*(long *)((long)in_RDI + 0x3b8) + 8) = 0;
  *(undefined2 *)(*(long *)((long)in_RDI + 0x3b8) + 0xc) = 1;
  *(undefined2 *)(*(long *)((long)in_RDI + 0x3b8) + 0xe) = 0;
  return;
}

Assistant:

void HFSubConsumer::initialize(){
    if(!actor)
        actor = zactor_new(ringbufController, this);
    //TODO: verify actor successfully initialized
    req = zsock_new_req(rependpoint.c_str());
    pollitem = (zmq_pollitem_t*)malloc(sizeof(zmq_pollitem_t));//{zsock_resolve(req), 0, ZMQ_POLLIN, 0};
    pollitem->socket = zsock_resolve(req);
    pollitem->fd = 0;
    pollitem->events = ZMQ_POLLIN;
    pollitem->revents = 0;
}